

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O1

int __thiscall sophia_interface::KLU(sophia_interface *this,int I,int J)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  undefined1 uVar14;
  undefined7 uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  double dVar21;
  double __y;
  
  uVar14 = SUB81(this,0);
  uVar15 = (undefined7)((ulong)this >> 8);
  uVar5 = 0;
  uVar17 = 0;
  uVar16 = 0;
  if (((-1 < I) && (0 < J)) && (uVar19 = (ulong)(uint)I, I <= MSTU[3])) {
    if (J == 1 && I == 0) {
      uVar17 = this->N;
    }
    else {
      uVar17 = uVar16;
      if (I == 0) {
        if (((J | 4U) == 6) && (0 < this->N)) {
          lVar18 = 0;
          uVar17 = 0;
          do {
            if (J == 2) {
              uVar17 = uVar17 + (this->K[0][lVar18] - 1U < 10);
            }
            if ((J == 6) && (this->K[0][lVar18] - 1U < 10)) {
              iVar4 = LUCHGE((sophia_interface *)CONCAT71(uVar15,uVar14),this->K[1][lVar18]);
              uVar17 = uVar17 + iVar4;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < this->N);
        }
      }
      else if (J < 6) {
        uVar17 = this->K[J - 1][I - 1];
      }
      else {
        if (J == 6) {
          iVar4 = LUCHGE(this,this->K[1][I - 1]);
          return iVar4;
        }
        if (J < 9) {
          uVar5 = this->K[0][I - 1U] - 1;
          if (J == 8) {
            uVar17 = 0;
            if (uVar5 < 10) {
              uVar17 = this->K[1][I - 1U];
            }
          }
          else {
            uVar17 = (uint)(uVar5 < 10);
          }
        }
        else if (J < 0xd) {
          uVar5 = this->K[1][I - 1];
          uVar17 = -uVar5;
          if (0 < (int)uVar5) {
            uVar17 = uVar5;
          }
          uVar6 = LUCOMP(this,uVar17);
          uVar16 = 0;
          if (uVar6 != 0) {
            uVar16 = KCHG[0][(long)(int)uVar6 + 499];
          }
          uVar12 = 0;
          if (J == 9) {
            uVar12 = uVar5;
          }
          if (uVar16 == 0) {
            uVar12 = uVar16;
          }
          uVar17 = uVar6;
          uVar2 = uVar6;
          if (uVar6 != 0) {
            uVar17 = uVar5;
            uVar2 = uVar12;
          }
          if (J != 10 || uVar16 != 0) {
            uVar17 = uVar2;
          }
          if (J == 0xb) {
            uVar17 = uVar6;
          }
          if ((J == 0xc) && (uVar17 = -uVar16, -1 < (int)uVar5)) {
            uVar17 = uVar16;
          }
        }
        else if (J == 0xd) {
          uVar17 = this->K[1][I - 1U];
          uVar5 = -uVar17;
          if (0 < (int)uVar17) {
            uVar5 = uVar17;
          }
          __y = (double)(int)(uVar5 / 100 + (uVar5 / 1000) * -10);
          dVar21 = pow(-1.0,__y);
          uVar17 = (int)(dVar21 * __y);
          if (uVar5 < 10) {
            uVar17 = uVar5;
          }
          uVar5 = uVar5 / 1000 + (uVar5 / 10000) * -10;
          if (uVar5 == 0) {
            uVar5 = uVar17;
          }
          uVar17 = -uVar5;
          if (-1 < this->K[1][I - 1U]) {
            uVar17 = uVar5;
          }
        }
        else if (J < 0x10) {
          uVar5 = 1;
          do {
            uVar17 = uVar5;
            uVar6 = (uint)uVar19;
            uVar16 = this->K[2][uVar6 - 1];
            uVar19 = (ulong)uVar16;
            if ((int)uVar16 < 1) break;
            uVar5 = uVar17 + 1;
          } while (this->K[0][uVar16 - 1] - 1U < 0x14);
          if (J == 0xf) {
            uVar17 = uVar6;
          }
        }
        else if (J == 0x10) {
          uVar5 = this->K[1][I - 1U];
          uVar16 = -uVar5;
          if (0 < (int)uVar5) {
            uVar16 = uVar5;
          }
          if ((this->K[0][I - 1U] < 0x15) &&
             ((uVar16 == 0x16 || uVar16 - 0xb < 10 ||
              ((100 < uVar16 &&
               (uVar5 = (uVar16 / 10) * -0x33333333,
               0x19999999 < (uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f))))))) {
            do {
              uVar9 = uVar19 & 0xffffffff;
              iVar8 = (int)uVar19;
              iVar4 = this->K[2][iVar8 - 1];
              uVar19 = (ulong)iVar4;
              if ((long)uVar19 < 1) {
                bVar20 = true;
              }
              else {
                uVar5 = this->K[1][iVar4 - 1];
                uVar16 = -uVar5;
                if (0 < (int)uVar5) {
                  uVar16 = uVar5;
                }
                bVar20 = 10 < uVar16;
              }
            } while ((0 < iVar4) && (bVar20));
            if (*(int *)((long)(this->K + -1) + 0x3e7c + uVar19 * 4) == 0xc) {
              if (iVar4 < iVar8) {
                uVar17 = 0;
                do {
                  if (this->K[2][uVar19] == iVar4) {
                    uVar17 = uVar17 + (this->K[1][uVar19] - 0x5eU < 0xfffffffd);
                  }
                  uVar19 = uVar19 + 1;
                } while ((long)iVar8 != uVar19);
              }
            }
            else {
              lVar18 = 0;
              do {
                iVar13 = (int)lVar18;
                if (this->N <= iVar13 + iVar8 + 1) break;
                lVar3 = uVar9 + lVar18;
                lVar18 = lVar18 + 1;
              } while (this->K[2][lVar3] == iVar4);
              uVar17 = iVar13 + 1;
            }
          }
        }
        else if (J == 0x12) {
          uVar5 = I - 1;
          uVar17 = 0;
          if (this->K[0][uVar5] - 0xbU < 2) {
            iVar8 = this->K[4][uVar5] - this->K[3][uVar5];
            iVar4 = -1;
            if (-1 < iVar8) {
              iVar4 = iVar8;
            }
            uVar17 = iVar4 + 1;
          }
          if ((this->K[3][uVar5] == 0) || (this->K[4][uVar5] == 0)) {
            uVar17 = 0;
          }
        }
        else if (J == 0x11) {
          uVar16 = 0;
          do {
            iVar13 = (int)uVar19;
            iVar4 = this->K[1][(long)iVar13 + 3999];
            uVar19 = (ulong)iVar4;
            iVar8 = 1;
            if (1 < iVar4) {
              iVar8 = iVar4;
            }
            iVar7 = LUCOMP((sophia_interface *)CONCAT71(uVar15,uVar14),this->K[1][iVar8 - 1U]);
            if ((((uVar19 == 0) || (iVar8 = this->K[0][iVar8 - 1U], iVar8 < 1)) || (iVar7 == 0)) ||
               (bVar20 = true, uVar17 = uVar16 + 1, 0x14 < iVar8)) {
              bVar20 = false;
              uVar17 = -(uint)(uVar16 == 0) | uVar16 + 1;
              uVar5 = uVar17;
              if (1 < (int)uVar17) {
                uVar17 = 0;
                uVar5 = 0;
              }
            }
            uVar16 = uVar17;
            if (!bVar20) {
              return uVar5;
            }
          } while (KCHG[0][(long)iVar7 + 499] == 0);
          uVar17 = 0;
          if (*(int *)((long)(this->K + -1) + 0x3e7c + uVar19 * 4) == 0xc) {
            iVar8 = this->N;
            iVar10 = iVar4;
            iVar7 = iVar4 + 1;
            if (iVar4 + 1 < iVar8) {
              iVar7 = iVar8;
            }
            do {
              iVar11 = iVar7;
              if ((long)iVar8 <= (long)(uVar19 + 1)) break;
              iVar11 = iVar10 + 1;
              piVar1 = this->K[0] + uVar19;
              iVar10 = iVar11;
              uVar19 = uVar19 + 1;
            } while (*piVar1 != 0xb);
            iVar7 = this->K[1][(long)iVar13 + 0xf9e];
            iVar10 = this->K[2][iVar13];
            if (iVar7 <= iVar11 && iVar4 <= iVar7) {
              uVar16 = 0;
            }
            uVar17 = 0;
            if (iVar11 < iVar10 || iVar10 < iVar4) {
              uVar17 = uVar16;
            }
            if (iVar8 <= iVar13) {
              uVar17 = uVar16;
            }
          }
        }
        else if (J < 0x17) {
          uVar16 = I - 1;
          uVar5 = this->K[0][uVar16];
          if ((uVar5 < 0xf) && ((0x6008U >> (uVar5 & 0x1f) & 1) != 0)) {
            uVar17 = 0;
            if (J == 0x13) {
              uVar19 = (long)this->K[3][uVar16] / (long)MSTU[4];
              uVar17 = (uint)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 |
                                    uVar19 & 0xffffffff) % (long)MSTU[4]);
            }
            if (J == 0x14) {
              uVar19 = (long)this->K[4][uVar16] / (long)MSTU[4];
              uVar17 = (uint)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 |
                                    uVar19 & 0xffffffff) % (long)MSTU[4]);
            }
            if (J == 0x15) {
              uVar17 = this->K[3][uVar16] % MSTU[4];
            }
            if (J == 0x16) {
              uVar17 = this->K[4][uVar16] % MSTU[4];
            }
          }
        }
      }
    }
  }
  return uVar17;
}

Assistant:

int sophia_interface::KLU(int I, int J) {
// Purpose: to provide various integer-valued event related data.
    // Default value. For I=0 number of entries, number of stable entries
    // or 3 times total charge.
    int result = 0;
    int KFA = 0;
    int KC = 0;
    if (I < 0 || I > MSTU[3] || J <= 0) {
        // do nothing
    } else if (I == 0 && J == 1) {
        result = N;
    } else if (I == 0 && (J == 2 || J == 6)) {
        for (int I1 = 0; I1 < N; ++I1) {
            if (J == 2 && K[0][I1] >= 1 && K[0][I1] <= 10) result++;
            if (J == 6 && K[0][I1] >= 1 && K[0][I1] <= 10) result += LUCHGE(K[1][I1]);
        }
    } else if (I == 0) {
        // do nothing
    // For I > 0 direct readout of K matrix or charge.
    } else if (J <= 5) {
        result = K[J - 1][I - 1];
    } else if (J == 6) {
        result = LUCHGE(K[1][I - 1]);

    // Status (existing/fragmented/decayed), parton/hadron separation.
    } else if (J <= 8) {
        if (K[0][I - 1] >= 1 && K[0][I - 1] <= 10) result = 1;
        if (J == 8) result *= K[1][I - 1];
    } else if (J <= 12) {
        KFA = std::abs(K[1][I - 1]);
        KC = LUCOMP(KFA);
        int KQ = 0;
        if (KC != 0) KQ = KCHG[1][KC - 1];
        if (J == 9 && KC != 0 && KQ != 0) result = K[1][I - 1];
        if (J == 10 && KC != 0 && KQ == 0) result = K[1][I - 1];
        if (J == 11) result = KC;
        if (J == 12) {
            int sgn = (K[1][I - 1] < 0)? -1 : 1;
            result = KQ * sgn;
        }

    // Heaviest flavour in hadron/diquark.
    } else if (J == 13) {
        KFA = std::abs(K[1][I - 1]);
        result = (KFA / 100) % 10 * std::pow(-1, (KFA / 100) % 10);
        if (KFA < 10) result = KFA;
        if ((KFA / 1000) % 10 != 0) result = (KFA / 1000) % 10;
        int sgn = (K[1][I - 1] < 0)? -1 : 1;
        result = result * sgn;

    // Particle history: generation, ancestor, rank.
    } else if (J <= 15) {
        int I2 = I;
        int I1 = I;
        do {
            result++;
            I2 = I1;
            I1 = K[2][I1 - 1];
        } while (I1 > 0 && K[0][I1 - 1] > 0 && K[0][I1 - 1] <= 20);
        if (J == 15) result = I2;
    } else if (J == 16) {
        KFA = std::abs(K[1][I - 1]);
        if (K[0][I - 1] <= 20 && ((KFA >= 11 && KFA <= 20) || KFA == 22 || (KFA > 100 && (KFA / 10) % 10 != 0))) {
            int I1 = I;
            int ILP = 1;
            int I2 = I1;
            do {
                I2 = I1;
                I1 = K[2][I1 - 1];
                if (I1 > 0) {
                    int KFAM = std::abs(K[1][I1 - 1]);
                    if (KFAM =! 0 && KFAM <= 10) ILP = 0;
                    if (KFAM == 21 || KFAM == 91 || KFAM == 92 || KFAM == 93) ILP = 0;
                    if (KFAM > 100 && (KFAM / 10) % 10 == 0) ILP = 0;
                }
            } while (ILP == 1 && I1 > 0);

            if (K[0][I1 - 1] == 12) {
                for (int I3 = I1; I3 < I2; ++I3) {
                    if (K[2][I3] == K[2][I2 - 1] && K[1][I3] != 91 && K[1][I3] != 92 && K[1][I3] != 93) result++;
                }
            } else {
                int I3 = I2;
                do {
                    result++;
                    I3++;
                } while (I3 < N && K[2][I3 - 1] == K[2][I2 - 1]);
            }
        }

    // Particle coming from collapsing jet system or not.
    } else if (J == 17) {
        int I1 = I;
        int I3 = I1;
        do {
            result++;
            I3 = I1;
            I1 = K[2][I1 - 1];
            int I0 = std::max(1, I1);
            KC = LUCOMP(K[1][I0 - 1]);
            if (I1 == 0 || K[0][I0 - 1] <= 0 || K[0][I0 - 1] > 20 || KC == 0) {
                if (result == 1) result = -1;
                if (result > 1) result = 0;
                return result;
            }
        } while (KCHG[1][KC - 1] == 0);
        if (K[0][I1 - 1] != 12) return 0;
        int I2 = I1;
        do {
            I2++;
        } while (I2 < N && K[0][I2 - 1] != 11);
        int K3M = K[2][I3 - 2];
        if (K3M >= I1 && K3M <= I2) result = 0;
        int K3P = K[2][I3];
        if (I3 < N && K3P >= I1 && K3P <= I2) result = 0;

    // Number of decay products. Colour flow.
    } else if (J == 18) {
        if (K[0][I - 1] == 11 || K[0][I - 1] == 12) result = std::max(0, K[4][I - 1] - K[3][I - 1] + 1);
        if (K[3][I - 1] == 0 || K[4][I - 1] == 0) result = 0;
    } else if (J <= 22) {
        if (K[0][I - 1] != 3 && K[0][I - 1] != 13 && K[0][I - 1] != 14) return result; 
        if (J == 19) result = (K[3][I - 1] / MSTU[4]) % MSTU[4];
        if (J == 20) result = (K[4][I - 1] / MSTU[4]) % MSTU[4];
        if (J == 21) result = K[3][I - 1] % MSTU[4];
        if (J == 22) result = K[4][I - 1] % MSTU[4];
    }

    return result;
}